

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::EqualElement<std::basic_string_view<char,std::char_traits<char>>>::operator()
          (void *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  string_view lhs_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *param_2_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> *this_local;
  
  lhs_00._M_len = lhs->_M_len;
  lhs_00._M_str = lhs->_M_str;
  bVar1 = StringEq::operator()(*(StringEq **)((long)this + 8),lhs_00,**this);
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }